

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O1

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::AppendParams
          (iuCsvFileParamsGenerator<float> *this,params_t *params,string *data)

{
  byte bVar1;
  int iVar2;
  byte *__nptr;
  iterator __position;
  int *piVar3;
  undefined8 uVar4;
  byte *pbVar5;
  bool bVar6;
  float param;
  float local_34;
  byte *local_30;
  
  __nptr = (byte *)(data->_M_dataplus)._M_p;
  bVar6 = data->_M_string_length == 0;
  if (!bVar6) {
    pbVar5 = __nptr;
    do {
      bVar1 = *pbVar5;
      if (((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar5 = pbVar5 + 1;
      }
    } while (((bVar1 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) &&
            (bVar6 = pbVar5 == __nptr + data->_M_string_length, !bVar6));
  }
  if (bVar6) {
    return;
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  local_34 = strtof((char *)__nptr,(char **)&local_30);
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stof");
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_00125a68;
    local_34 = (float)std::__throw_out_of_range("stof");
  }
  *piVar3 = iVar2;
LAB_00125a68:
  __position._M_current =
       (params->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (params->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)params,__position,&local_34);
  }
  else {
    *__position._M_current = local_34;
    (params->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }